

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateFboUnbindReadCase::render
          (InvalidateFboUnbindReadCase *this,Surface *dst)

{
  deUint32 dVar1;
  DataType DVar2;
  deUint32 program;
  int iVar3;
  int iVar4;
  Context *pCVar5;
  TransferFormat TVar6;
  size_type sVar7;
  reference attachments_00;
  DataTypes *pDVar8;
  ContextWrapper *pCVar9;
  bool local_63a;
  bool local_639;
  Vector<float,_3> local_62c;
  Vector<float,_3> local_620;
  deUint32 local_614;
  deUint32 texShaderID_1;
  Vector<float,_4> local_600;
  float local_5f0 [2];
  DataTypes local_5e8;
  undefined1 local_5c8 [8];
  Texture2DShader texShader_1;
  Vector<float,_3> local_420;
  deUint32 local_414;
  deUint32 texShaderID;
  Vector<float,_4> local_400;
  TextureFormat local_3f0;
  DataTypes local_3e8;
  undefined1 local_3c8 [8];
  Texture2DShader texShader;
  Vector<float,_3> local_224;
  float local_218 [2];
  TransferFormat local_210;
  TransferFormat transferFmt_1;
  deUint32 local_200;
  deUint32 dStack_1fc;
  TransferFormat transferFmt;
  deUint32 gradShaderID;
  undefined1 local_1e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  GradientShader gradShader;
  deUint32 depthStencilTex;
  deUint32 colorTex;
  deUint32 fbo;
  bool stencil;
  bool depth;
  TextureFormatInfo colorFmtInfo;
  TextureFormat depthStencilFmt;
  TextureFormat colorFmt;
  Surface *dst_local;
  InvalidateFboUnbindReadCase *this_local;
  
  depthStencilFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  }
  else {
    colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_depthStencilFmt);
  }
  tcu::getTextureFormatInfo((TextureFormatInfo *)&fbo,&depthStencilFmt);
  local_639 = colorFmtInfo.lookupBias.m_data[2] == 2.52234e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  colorTex._3_1_ = local_639;
  local_63a = colorFmtInfo.lookupBias.m_data[2] == 2.66247e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  colorTex._2_1_ = local_63a;
  depthStencilTex = 0;
  gradShader.super_ShaderProgram._340_4_ = 0;
  gradShader.super_ShaderProgram.m_hasGeometryShader = false;
  gradShader.super_ShaderProgram._337_3_ = 0;
  DVar2 = FboTestUtil::getFragmentOutputType(&depthStencilFmt);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,DVar2);
  getFBODiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,
             this->m_invalidateBuffers);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  program = (*pCVar5->_vptr_Context[0x75])
                      (pCVar5,&attachments.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  transferFmt_1.format = depthStencilFmt.order;
  transferFmt_1.dataType = depthStencilFmt.type;
  TVar6 = glu::getTransferFormat(depthStencilFmt);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&gradShader.super_ShaderProgram.field_0x154);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
             gradShader.super_ShaderProgram._340_4_);
  pCVar9 = &(this->super_FboTestCase).super_ContextWrapper;
  dVar1 = this->m_colorFmt;
  iVar3 = sglr::ContextWrapper::getWidth(pCVar9);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  local_200 = TVar6.format;
  dStack_1fc = TVar6.dataType;
  sglr::ContextWrapper::glTexImage2D
            (pCVar9,0xde1,0,dVar1,iVar3,iVar4,0,local_200,dStack_1fc,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2601);
  if (this->m_depthStencilFmt != 0) {
    local_218[0] = colorFmtInfo.lookupBias.m_data[2];
    local_218[1] = colorFmtInfo.lookupBias.m_data[3];
    local_210 = glu::getTransferFormat((TextureFormat)colorFmtInfo.lookupBias.m_data._8_8_);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboTestCase).super_ContextWrapper,1,
               (deUint32 *)&gradShader.super_ShaderProgram.m_hasGeometryShader);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
               gradShader.super_ShaderProgram._336_4_);
    pCVar9 = &(this->super_FboTestCase).super_ContextWrapper;
    dVar1 = this->m_depthStencilFmt;
    iVar3 = sglr::ContextWrapper::getWidth(pCVar9);
    iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
    sglr::ContextWrapper::glTexImage2D
              (pCVar9,0xde1,0,dVar1,iVar3,iVar4,0,local_210.format,local_210.dataType,(void *)0x0);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2600);
  }
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilTex);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilTex);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0xde1,
             gradShader.super_ShaderProgram._340_4_,0);
  if ((colorTex._3_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0xde1,
               gradShader.super_ShaderProgram._336_4_,0);
  }
  if ((colorTex._2_1_ & 1) != 0) {
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0xde1,
               gradShader.super_ShaderProgram._336_4_,0);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar5,program,(Vec4 *)&fbo,
             (Vec4 *)(colorFmtInfo.valueMin.m_data + 2));
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  tcu::Vector<float,_3>::Vector(&local_224,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&texShader.m_outputType,1.0,1.0,1.0);
  sglr::drawQuad(pCVar5,program,&local_224,(Vec3 *)&texShader.m_outputType);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
  attachments_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,0);
  sglr::ContextWrapper::glInvalidateFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar7,attachments_00);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  if ((this->m_invalidateBuffers & 0x100) == 0) {
    local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FboTestUtil::DataTypes::DataTypes(&local_5e8);
    local_5f0[0] = colorFmtInfo.lookupBias.m_data[2];
    local_5f0[1] = colorFmtInfo.lookupBias.m_data[3];
    DVar2 = glu::getSampler2DType((TextureFormat)colorFmtInfo.lookupBias.m_data._8_8_);
    pDVar8 = FboTestUtil::DataTypes::operator<<(&local_5e8,DVar2);
    tcu::Vector<float,_4>::Vector(&local_600,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff9f0,0.0);
    FboTestUtil::Texture2DShader::Texture2DShader
              ((Texture2DShader *)local_5c8,pDVar8,TYPE_FLOAT_VEC4,&local_600,
               (Vec4 *)&stack0xfffffffffffff9f0);
    FboTestUtil::DataTypes::~DataTypes(&local_5e8);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    local_614 = (*pCVar5->_vptr_Context[0x75])(pCVar5,local_5c8);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_5c8,pCVar5,local_614);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
               gradShader.super_ShaderProgram._336_4_);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_614;
    tcu::Vector<float,_3>::Vector(&local_620,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_62c,1.0,1.0,0.0);
    sglr::drawQuad(pCVar5,dVar1,&local_620,&local_62c);
    FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_5c8);
  }
  else {
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FboTestUtil::DataTypes::DataTypes(&local_3e8);
    local_3f0 = depthStencilFmt;
    DVar2 = glu::getSampler2DType(depthStencilFmt);
    pDVar8 = FboTestUtil::DataTypes::operator<<(&local_3e8,DVar2);
    tcu::Vector<float,_4>::Vector(&local_400,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffbf0,0.0);
    FboTestUtil::Texture2DShader::Texture2DShader
              ((Texture2DShader *)local_3c8,pDVar8,TYPE_FLOAT_VEC4,&local_400,
               (Vec4 *)&stack0xfffffffffffffbf0);
    FboTestUtil::DataTypes::~DataTypes(&local_3e8);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    local_414 = (*pCVar5->_vptr_Context[0x75])();
    FboTestUtil::Texture2DShader::setTexScaleBias
              ((Texture2DShader *)local_3c8,0,(Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
               (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_3c8,pCVar5,local_414);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
               gradShader.super_ShaderProgram._340_4_);
    pCVar5 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_414;
    tcu::Vector<float,_3>::Vector(&local_420,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&texShader_1.field_0x194,1.0,1.0,0.0);
    sglr::drawQuad(pCVar5,dVar1,&local_420,(Vec3 *)&texShader_1.field_0x194);
    FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_3c8);
  }
  iVar3 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar3,iVar4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorTex				= 0;
		deUint32				depthStencilTex			= 0;
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);

		// Create fbo.
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(colorFmt);

			glGenTextures	(1, &colorTex);
			glBindTexture	(GL_TEXTURE_2D, colorTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_colorFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		if (m_depthStencilFmt != GL_NONE)
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(depthStencilFmt);

			glGenTextures	(1, &depthStencilTex);
			glBindTexture	(GL_TEXTURE_2D, depthStencilTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_depthStencilFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		glGenFramebuffers		(1, &fbo);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorTex, 0);

		if (depth)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		if (stencil)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0]);

		glBindFramebuffer	(GL_FRAMEBUFFER, 0);
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Render color.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(colorFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setTexScaleBias(0, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, colorTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}
		else
		{
			// Render depth.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(depthStencilFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, depthStencilTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}